

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arg_Data.h
# Opt level: O0

void __thiscall
Nova::Arg_Data::Arg_Data
          (Arg_Data *this,string *input_str,string *input_val_name,string *input_desc,
          int default_value)

{
  string *input_desc_00;
  string *input_val_name_00;
  string *input_str_00;
  allocator local_61;
  string local_60 [52];
  int local_2c;
  string *psStack_28;
  int default_value_local;
  string *input_desc_local;
  string *input_val_name_local;
  string *input_str_local;
  Arg_Data *this_local;
  
  this->type = INTEGER;
  local_2c = default_value;
  psStack_28 = input_desc;
  input_desc_local = input_val_name;
  input_val_name_local = input_str;
  input_str_local = (string *)this;
  std::__cxx11::string::string((string *)&this->str);
  std::__cxx11::string::string((string *)&this->val_name);
  std::__cxx11::string::string((string *)&this->desc);
  this->boolean_value = false;
  this->integer_default = local_2c;
  this->integer_value = local_2c;
  this->double_default = 0.0;
  this->double_value = 0.0;
  Vector<double,_2,_true>::Vector(&this->vector_2d_default);
  Vector<double,_2,_true>::Vector(&this->vector_2d_value);
  Vector<double,_3,_true>::Vector(&this->vector_3d_default);
  Vector<double,_3,_true>::Vector(&this->vector_3d_value);
  std::__cxx11::string::string((string *)&this->string_default);
  std::__cxx11::string::string((string *)&this->string_value);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->list_value);
  input_str_00 = input_val_name_local;
  input_val_name_00 = input_desc_local;
  input_desc_00 = psStack_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"int",&local_61);
  Initialize(this,input_str_00,input_val_name_00,input_desc_00,(string *)local_60);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  return;
}

Assistant:

Arg_Data(const std::string& input_str,const std::string& input_val_name,const std::string& input_desc,int default_value)
        :type(INTEGER),boolean_value(false),integer_default(default_value),integer_value(default_value),double_default(0),double_value(0)
    {
        Initialize(input_str,input_val_name,input_desc,"int");
    }